

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEvent.cpp
# Opt level: O0

void __thiscall smf::MidiEvent::~MidiEvent(MidiEvent *this)

{
  MidiEvent *this_local;
  
  this->track = -1;
  this->tick = -1;
  this->seconds = -1.0;
  this->seq = -1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,0);
  this->m_eventlink = (MidiEvent *)0x0;
  MidiMessage::~MidiMessage(&this->super_MidiMessage);
  return;
}

Assistant:

MidiEvent::~MidiEvent() {
	track   = -1;
	tick    = -1;
	seconds = -1.0;
	seq     = -1;
	this->resize(0);
	m_eventlink = NULL;
}